

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O2

DecodePsbtResponseStruct * __thiscall
cfd::api::json::DecodePsbtResponse::ConvertToStruct
          (DecodePsbtResponseStruct *__return_storage_ptr__,DecodePsbtResponse *this)

{
  DecodeRawTransactionResponseStruct local_d0;
  
  DecodePsbtResponseStruct::DecodePsbtResponseStruct(__return_storage_ptr__);
  DecodeRawTransactionResponse::ConvertToStruct(&local_d0,&this->tx_);
  DecodeRawTransactionResponseStruct::operator=(&__return_storage_ptr__->tx,&local_d0);
  DecodeRawTransactionResponseStruct::~DecodeRawTransactionResponseStruct(&local_d0);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->tx_hex);
  core::JsonObjectVector<cfd::api::json::PsbtGlobalXpub,_PsbtGlobalXpubStruct>::ConvertToStruct
            ((vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_> *)&local_d0,
             &this->xpubs_);
  std::vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>::_M_move_assign
            (&__return_storage_ptr__->xpubs,&local_d0);
  std::vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>::~vector
            ((vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_> *)&local_d0);
  __return_storage_ptr__->version = this->version_;
  core::JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct>::ConvertToStruct
            ((vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)&local_d0,
             &this->unknown_);
  std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>::_M_move_assign
            (&__return_storage_ptr__->unknown,&local_d0);
  std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>::~vector
            ((vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)&local_d0);
  core::JsonObjectVector<cfd::api::json::DecodePsbtInput,_DecodePsbtInputStruct>::ConvertToStruct
            ((vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_> *)&local_d0,
             &this->inputs_);
  std::vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>::_M_move_assign
            (&__return_storage_ptr__->inputs,&local_d0);
  std::vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_>::~vector
            ((vector<DecodePsbtInputStruct,_std::allocator<DecodePsbtInputStruct>_> *)&local_d0);
  core::JsonObjectVector<cfd::api::json::DecodePsbtOutput,_DecodePsbtOutputStruct>::ConvertToStruct
            ((vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_> *)&local_d0,
             &this->outputs_);
  std::vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>::_M_move_assign
            (&__return_storage_ptr__->outputs,&local_d0);
  std::vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>::~vector
            ((vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_> *)&local_d0);
  __return_storage_ptr__->fee = this->fee_;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

DecodePsbtResponseStruct DecodePsbtResponse::ConvertToStruct() const {  // NOLINT
  DecodePsbtResponseStruct result;
  result.tx = tx_.ConvertToStruct();
  result.tx_hex = tx_hex_;
  result.xpubs = xpubs_.ConvertToStruct();
  result.version = version_;
  result.unknown = unknown_.ConvertToStruct();
  result.inputs = inputs_.ConvertToStruct();
  result.outputs = outputs_.ConvertToStruct();
  result.fee = fee_;
  result.ignore_items = ignore_items;
  return result;
}